

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.h
# Opt level: O3

bool __thiscall
rlottie::internal::renderer::Polystar::hasChanged(Polystar *this,int prevFrame,int curFrame)

{
  float fVar1;
  Polystar *pPVar2;
  details dVar3;
  undefined8 *puVar4;
  byte bVar5;
  
  pPVar2 = this->mData;
  if ((pPVar2->mPos).isValue_ == false) {
    dVar3 = (pPVar2->mPos).impl_;
    fVar1 = **(float **)dVar3;
    if ((fVar1 <= (float)prevFrame) || (fVar1 <= (float)curFrame)) {
      fVar1 = *(float *)(*(long *)((long)dVar3 + 8) + -0x1c);
      bVar5 = 1;
      if (((float)prevFrame <= fVar1) || ((float)curFrame <= fVar1)) goto LAB_0012cdbb;
    }
  }
  if ((pPVar2->mPointCount).isValue_ == false) {
    puVar4 = *(undefined8 **)&(pPVar2->mPointCount).impl_.value_;
    fVar1 = *(float *)*puVar4;
    if ((fVar1 <= (float)prevFrame) || (fVar1 <= (float)curFrame)) {
      fVar1 = *(float *)(puVar4[1] + -0x14);
      bVar5 = 1;
      if (((float)prevFrame <= fVar1) || ((float)curFrame <= fVar1)) goto LAB_0012cdbb;
    }
  }
  if ((pPVar2->mInnerRadius).isValue_ == false) {
    puVar4 = *(undefined8 **)&(pPVar2->mInnerRadius).impl_.value_;
    fVar1 = *(float *)*puVar4;
    if ((fVar1 <= (float)prevFrame) || (fVar1 <= (float)curFrame)) {
      fVar1 = *(float *)(puVar4[1] + -0x14);
      bVar5 = 1;
      if (((float)prevFrame <= fVar1) || ((float)curFrame <= fVar1)) goto LAB_0012cdbb;
    }
  }
  if ((pPVar2->mOuterRadius).isValue_ == false) {
    puVar4 = *(undefined8 **)&(pPVar2->mOuterRadius).impl_.value_;
    fVar1 = *(float *)*puVar4;
    if ((fVar1 <= (float)prevFrame) || (fVar1 <= (float)curFrame)) {
      fVar1 = *(float *)(puVar4[1] + -0x14);
      bVar5 = 1;
      if (((float)prevFrame <= fVar1) || ((float)curFrame <= fVar1)) goto LAB_0012cdbb;
    }
  }
  if ((pPVar2->mInnerRoundness).isValue_ == false) {
    puVar4 = *(undefined8 **)&(pPVar2->mInnerRoundness).impl_.value_;
    fVar1 = *(float *)*puVar4;
    if ((fVar1 <= (float)prevFrame) || (fVar1 <= (float)curFrame)) {
      fVar1 = *(float *)(puVar4[1] + -0x14);
      bVar5 = 1;
      if (((float)prevFrame <= fVar1) || ((float)curFrame <= fVar1)) goto LAB_0012cdbb;
    }
  }
  if ((pPVar2->mOuterRoundness).isValue_ == false) {
    puVar4 = *(undefined8 **)&(pPVar2->mOuterRoundness).impl_.value_;
    fVar1 = *(float *)*puVar4;
    if ((fVar1 <= (float)prevFrame) || (fVar1 <= (float)curFrame)) {
      fVar1 = *(float *)(puVar4[1] + -0x14);
      bVar5 = 1;
      if (((float)prevFrame <= fVar1) || ((float)curFrame <= fVar1)) goto LAB_0012cdbb;
    }
  }
  if ((pPVar2->mRotation).isValue_ == false) {
    puVar4 = *(undefined8 **)&(pPVar2->mRotation).impl_.value_;
    fVar1 = *(float *)*puVar4;
    if ((fVar1 <= (float)prevFrame) || (fVar1 <= (float)curFrame)) {
      fVar1 = *(float *)(puVar4[1] + -0x14);
      bVar5 = -((float)prevFrame <= fVar1) | -((float)curFrame <= fVar1);
      goto LAB_0012cdbb;
    }
  }
  bVar5 = 0;
LAB_0012cdbb:
  return (bool)(bVar5 & 1);
}

Assistant:

bool hasChanged(int prevFrame, int curFrame) final
    {
        return (mData->mPos.changed(prevFrame, curFrame) ||
                mData->mPointCount.changed(prevFrame, curFrame) ||
                mData->mInnerRadius.changed(prevFrame, curFrame) ||
                mData->mOuterRadius.changed(prevFrame, curFrame) ||
                mData->mInnerRoundness.changed(prevFrame, curFrame) ||
                mData->mOuterRoundness.changed(prevFrame, curFrame) ||
                mData->mRotation.changed(prevFrame, curFrame));
    }